

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void ra_to_uint32_array(roaring_array_t *ra,uint32_t *ans)

{
  uint32_t *out;
  ushort uVar1;
  uint8_t uVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t base;
  run_container_t *cont;
  long lVar5;
  long lVar6;
  
  if (0 < ra->size) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      cont = (run_container_t *)ra->containers[lVar6];
      uVar2 = ra->typecodes[lVar6];
      uVar1 = ra->keys[lVar6];
      if (uVar2 == '\x04') {
        uVar2 = *(uint8_t *)&cont->runs;
        if (uVar2 == '\x04') {
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        cont = *(run_container_t **)cont;
      }
      out = ans + lVar5;
      base = (uint)uVar1 << 0x10;
      if (uVar2 == '\x03') {
        uVar3 = run_container_to_uint32_array(out,cont,base);
        uVar4 = (ulong)uVar3;
      }
      else if (uVar2 == '\x02') {
        if (cont->n_runs < 1) {
          uVar4 = 0;
        }
        else {
          uVar4 = 0;
          do {
            out[uVar4] = CONCAT22(uVar1,(&cont->runs->value)[uVar4]);
            uVar4 = uVar4 + 1;
          } while ((long)uVar4 < (long)cont->n_runs);
        }
      }
      else {
        if (uVar2 != '\x01') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x11e6,
                        "int container_to_uint32_array(uint32_t *, const container_t *, uint8_t, uint32_t)"
                       );
        }
        uVar3 = bitset_container_to_uint32_array(out,(bitset_container_t *)cont,base);
        uVar4 = (ulong)uVar3;
      }
      lVar5 = lVar5 + (int)uVar4;
      lVar6 = lVar6 + 1;
    } while (lVar6 < ra->size);
  }
  return;
}

Assistant:

void ra_to_uint32_array(const roaring_array_t *ra, uint32_t *ans) {
    size_t ctr = 0;
    for (int32_t i = 0; i < ra->size; ++i) {
        int num_added = container_to_uint32_array(
            ans + ctr, ra->containers[i], ra->typecodes[i],
            ((uint32_t)ra->keys[i]) << 16);
        ctr += num_added;
    }
}